

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringSliceWTF
          (PrintExpressionContents *this,StringSliceWTF *curr)

{
  StringSliceWTF *curr_local;
  PrintExpressionContents *this_local;
  
  if (curr->op == StringSliceWTF8) {
    printMedium(this->o,"stringview_wtf8.slice");
  }
  else {
    if (curr->op != StringSliceWTF16) {
      handle_unreachable("invalid string.slice*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0x9d9);
    }
    printMedium(this->o,"stringview_wtf16.slice");
  }
  return;
}

Assistant:

void visitStringSliceWTF(StringSliceWTF* curr) {
    switch (curr->op) {
      case StringSliceWTF8:
        printMedium(o, "stringview_wtf8.slice");
        break;
      case StringSliceWTF16:
        printMedium(o, "stringview_wtf16.slice");
        break;
      default:
        WASM_UNREACHABLE("invalid string.slice*");
    }
  }